

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O2

Token * has_tok_dollar(List *ls,TokenType type,int number)

{
  Token *pTVar1;
  
  while( true ) {
    if (ls == (List *)0x0) {
      return (Token *)0x0;
    }
    if (((ls->token).type == type) && ((uint)(ls->token).u.reginfo.which == number)) break;
    pTVar1 = has_tok_dollar(ls->car,type,number);
    if (pTVar1 != (Token *)0x0) {
      return pTVar1;
    }
    ls = ls->cdr;
  }
  return &ls->token;
}

Assistant:

static Token *
has_tok_dollar (List *ls, TokenType type, int number)
{
  Token *t;

  if (ls == NULL)
    return NULL;
  if (ls->token.type == type
      && ls->token.u.dollarinfo.which == number)
    return &ls->token;
  t = has_tok_dollar (ls->car, type, number);
  if (t != NULL)
    return t;
  return has_tok_dollar (ls->cdr, type, number);
}